

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BatchnormLayerParams::ByteSizeLong(BatchnormLayerParams *this)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  size_t sVar4;
  float fVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  BatchnormLayerParams *this_local;
  
  sStack_18 = 0;
  bVar1 = has_gamma(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->gamma_);
    sStack_18 = sStack_18 + 1;
  }
  bVar1 = has_beta(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->beta_);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  bVar1 = has_mean(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->mean_);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  bVar1 = has_variance(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->variance_);
    sStack_18 = sVar4 + 2 + sStack_18;
  }
  uVar3 = channels(this);
  if (uVar3 != 0) {
    uVar3 = channels(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  bVar1 = computemeanvar(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  bVar1 = instancenormalization(this);
  if (bVar1) {
    sStack_18 = sStack_18 + 2;
  }
  fVar5 = epsilon(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t BatchnormLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BatchnormLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams gamma = 15;
  if (this->has_gamma()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->gamma_);
  }

  // .CoreML.Specification.WeightParams beta = 16;
  if (this->has_beta()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta_);
  }

  // .CoreML.Specification.WeightParams mean = 17;
  if (this->has_mean()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mean_);
  }

  // .CoreML.Specification.WeightParams variance = 18;
  if (this->has_variance()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->variance_);
  }

  // uint64 channels = 1;
  if (this->channels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->channels());
  }

  // bool computeMeanVar = 5;
  if (this->computemeanvar() != 0) {
    total_size += 1 + 1;
  }

  // bool instanceNormalization = 6;
  if (this->instancenormalization() != 0) {
    total_size += 1 + 1;
  }

  // float epsilon = 10;
  if (this->epsilon() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}